

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O0

void __thiscall booster::regex::regex(regex *this)

{
  data *this_00;
  copy_ptr<booster::regex::data> *in_RDI;
  
  this_00 = (data *)operator_new(0x50);
  data::data(this_00);
  copy_ptr<booster::regex::data>::copy_ptr(in_RDI,this_00);
  return;
}

Assistant:

regex::regex() : d(new data()) 
	{
	}